

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_switch::dump(statement_switch *this,ostream *o)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  statement_block *psVar5;
  _Elt_pointer ppsVar6;
  anon_union_8_1_a8a14541_for_iterator_1 this_00;
  long lVar7;
  statement_base **ptr;
  undefined8 *puVar8;
  _Elt_pointer ppsVar9;
  statement_base **ptr_1;
  _Elt_pointer ppsVar10;
  undefined8 *puVar11;
  _Map_pointer pppsVar12;
  const_iterator __begin1;
  iterator local_60;
  string local_50;
  
  std::operator<<(o,"< BeginSwitch: Condition = ");
  compiler_type::dump_expr((this->mTree).mRoot,o);
  std::operator<<(o," >\n");
  local_60 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
             ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                      *)&this->mCases);
  pcVar1 = (this->mCases).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           .ctrl_;
  sVar2 = (this->mCases).
          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          .
          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          .capacity_;
  while (local_60.ctrl_ != pcVar1 + sVar2) {
    this_00 = local_60.field_1;
    std::operator<<(o,"< BeginCase: Tag = \"");
    cs_impl::any::to_string_abi_cxx11_(&local_50,(any *)this_00.slot_);
    std::operator<<(o,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator<<(o,"\" >\n");
    lVar3 = *(long *)((long)this_00.slot_ + 8);
    puVar8 = *(undefined8 **)(lVar3 + 0x30);
    puVar11 = *(undefined8 **)(lVar3 + 0x40);
    lVar7 = *(long *)(lVar3 + 0x48);
    puVar4 = *(undefined8 **)(lVar3 + 0x50);
    while (puVar8 != puVar4) {
      (**(code **)(*(long *)*puVar8 + 0x28))((long *)*puVar8,o);
      puVar8 = puVar8 + 1;
      if (puVar8 == puVar11) {
        puVar8 = *(undefined8 **)(lVar7 + 8);
        lVar7 = lVar7 + 8;
        puVar11 = puVar8 + 0x40;
      }
    }
    std::operator<<(o,"< EndCase >\n");
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
    ::iterator::operator++(&local_60);
  }
  if (this->mDefault != (statement_block *)0x0) {
    std::operator<<(o,"< BeginDefaultCase >\n");
    psVar5 = this->mDefault;
    ppsVar10 = (psVar5->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar9 = (psVar5->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar12 = (psVar5->mBlock).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar6 = (psVar5->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    while (ppsVar10 != ppsVar6) {
      (*(*ppsVar10)->_vptr_statement_base[5])(*ppsVar10,o);
      ppsVar10 = ppsVar10 + 1;
      if (ppsVar10 == ppsVar9) {
        ppsVar10 = pppsVar12[1];
        pppsVar12 = pppsVar12 + 1;
        ppsVar9 = ppsVar10 + 0x40;
      }
    }
    std::operator<<(o,"< EndDefaultCase >\n");
  }
  std::operator<<(o,"< EndSwitch >\n");
  return;
}

Assistant:

void statement_switch::dump(std::ostream &o) const
	{
		o << "< BeginSwitch: Condition = ";
		compiler_type::dump_expr(mTree.root(), o);
		o << " >\n";
		for (auto &it: mCases) {
			o << "< BeginCase: Tag = \"";
			o << it.first.to_string();
			o << "\" >\n";
			for (auto &ptr: it.second->get_block())
				ptr->dump(o);
			o << "< EndCase >\n";
		}
		if (mDefault != nullptr) {
			o << "< BeginDefaultCase >\n";
			for (auto &ptr: mDefault->get_block())
				ptr->dump(o);
			o << "< EndDefaultCase >\n";
		}
		o << "< EndSwitch >\n";
	}